

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::JitAllocator::alloc(JitAllocator *this,Span *out,size_t size)

{
  JitAllocatorPool *pJVar1;
  long *plVar2;
  JitAllocatorOptions JVar3;
  JitAllocatorPrivateImpl *impl;
  JitAllocatorBlock *pJVar4;
  void *p;
  Error EVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  JitAllocatorBlock *block;
  ulong extraout_RAX;
  uint32_t uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  JitAllocatorBlock *pJVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  BitWord *pBVar20;
  uint32_t uVar21;
  ulong *puVar22;
  size_t searchEnd;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  bool bVar28;
  DualMapping local_78;
  size_t local_60;
  BitWord *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  Span *local_38;
  ulong uVar14;
  
  out->_size = 0;
  out->_block = (void *)0x0;
  out->_rx = (void *)0x0;
  out->_rw = (void *)0x0;
  out->_flags = kNone;
  out->_reserved = 0;
  impl = (JitAllocatorPrivateImpl *)this->_impl;
  if (impl == (JitAllocatorPrivateImpl *)JitAllocatorImpl_none) {
    return 5;
  }
  uVar24 = (ulong)(impl->super_Impl).granularity;
  uVar24 = -uVar24 & (size + uVar24) - 1;
  if (uVar24 == 0) {
    return 2;
  }
  if (0x7fffffff < uVar24) {
    return 9;
  }
  pthread_mutex_lock((pthread_mutex_t *)&impl->lock);
  lVar10 = impl->poolCount - 1;
  if (lVar10 != 0) {
    uVar12 = (ulong)(impl->super_Impl).granularity << ((byte)lVar10 & 0x3f);
    do {
      if ((-uVar12 & uVar12 + (uVar24 - 1)) == uVar24) goto LAB_00120239;
      uVar12 = uVar12 >> 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  lVar10 = 0;
LAB_00120239:
  pJVar1 = impl->pools + lVar10;
  local_40 = (ulong)pJVar1->granularity;
  local_48 = (uVar24 - 1) + local_40 >> (pJVar1->granularityLog2 & 0x3f);
  pJVar4 = *(JitAllocatorBlock **)pJVar1;
  local_60 = uVar24;
  local_38 = out;
  if (pJVar4 != (JitAllocatorBlock *)0x0) {
    uVar12 = local_48 & 0xffffffff;
    block = pJVar4;
LAB_0012026f:
    pJVar15 = *(JitAllocatorBlock **)&block->field_0x18;
    if (*(JitAllocatorBlock **)&block->field_0x18 == (JitAllocatorBlock *)0x0) {
      pJVar15 = pJVar4;
    }
    uVar23 = (ulong)block->_areaSize;
    uVar13 = (uint)local_48;
    if ((uVar13 <= block->_areaSize - block->_areaUsed) &&
       ((uVar27 = block->_flags, (uVar27 & 4) != 0 || (uVar13 <= block->_largestUnusedArea)))) {
      uVar16 = (ulong)block->_searchEnd;
      if ((uint)(uVar23 + 0x3f >> 6) < (uint)(uVar16 + 0x3f >> 6)) {
        alloc();
        return 5;
      }
      uVar6 = block->_searchStart;
      uVar11 = (ulong)uVar6;
      pBVar20 = block->_usedBitVector;
      uVar18 = (ulong)(uVar6 & 0xffffffc0);
      puVar22 = pBVar20 + (uVar6 >> 6);
      if (uVar18 < uVar16) {
        uVar25 = (~*puVar22 >> ((byte)uVar6 & 0x3f)) << ((byte)uVar6 & 0x3f);
      }
      else {
        uVar25 = 0;
      }
      uVar19 = 0xffffffffffffffff;
      uVar7 = 0;
LAB_0012030b:
      uVar26 = uVar25;
      local_58 = pBVar20;
      local_50 = uVar11;
      if (uVar25 == 0) {
        do {
          uVar18 = uVar18 + 0x40;
          if (uVar16 <= uVar18) goto LAB_00120415;
          puVar17 = puVar22 + 1;
          puVar22 = puVar22 + 1;
        } while (*puVar17 == 0xffffffffffffffff);
        uVar26 = ~*puVar17;
      }
      lVar10 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
        }
      }
      uVar23 = -1L << ((byte)lVar10 & 0x3f);
      uVar14 = uVar18 + lVar10;
      uVar25 = uVar23 ^ uVar26;
      if (uVar23 == uVar26) {
        uVar26 = uVar18 + 0x40;
        uVar23 = uVar26;
        if (uVar16 < uVar26) {
          uVar23 = uVar16;
        }
        if ((uVar23 - uVar14 < uVar12) && (uVar18 = uVar26, uVar26 < uVar16)) {
LAB_00120377:
          puVar22 = puVar22 + 1;
          uVar25 = *puVar22;
          if (uVar25 == 0) {
            uVar25 = uVar18 + 0x40;
            uVar23 = uVar25;
            if (uVar16 < uVar25) {
              uVar23 = uVar16;
            }
            if (uVar23 - uVar14 < uVar12) goto code_r0x0012039b;
            uVar25 = 0;
          }
          else {
            lVar10 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            uVar23 = lVar10 + uVar18;
            if (uVar16 < lVar10 + uVar18) {
              uVar23 = uVar16;
            }
            uVar25 = -1L << ((byte)lVar10 & 0x3f) ^ uVar25;
          }
        }
      }
      else {
        lVar10 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        uVar23 = lVar10 + uVar18;
        if (uVar16 < lVar10 + uVar18) {
          uVar23 = uVar16;
        }
        uVar25 = uVar25 ^ -1L << ((byte)lVar10 & 0x3f);
      }
      goto LAB_001203ee;
    }
    goto LAB_00120437;
  }
LAB_00120440:
  if (*(long *)&pJVar1->field_0x8 == 0) {
    uVar12 = (ulong)(impl->super_Impl).blockSize;
  }
  else {
    uVar12 = *(ulong *)(*(long *)&pJVar1->field_0x8 + 0x38);
  }
  JVar3 = (impl->super_Impl).options;
  uVar16 = 0;
  if ((JVar3 & kDisableInitialPadding) == kNone) {
    uVar16 = local_40;
  }
  uVar16 = uVar16 + uVar24;
  uVar23 = uVar12 << (uVar12 < 0x4000000);
  if (uVar23 < uVar16) {
    uVar24 = (ulong)(impl->super_Impl).blockSize;
    uVar23 = -uVar24 & (uVar16 + uVar24) - 1;
    if (uVar16 <= uVar23) {
LAB_001204b6:
      local_78.rx = (void *)0x0;
      local_78.rw = (void *)0x0;
      uVar13 = (uint)((JVar3 & kDisableInitialPadding) == kNone);
      if ((JVar3 & kUseDualMapping) == kNone) {
        if ((JVar3 & kUseLargePages) == kNone) {
LAB_00120530:
          EVar5 = VirtMem::alloc(&local_78.rx,uVar23,kAccessRWX);
          uVar24 = uVar23;
          if (EVar5 != 0) goto LAB_00120867;
        }
        else {
          sVar8 = VirtMem::largePageSize();
          if (uVar23 < sVar8) {
            bVar28 = ((impl->super_Impl).options & kAlignBlockSizeToLargePage) == kNone;
          }
          else {
            bVar28 = false;
          }
          if ((sVar8 == 0) || (bVar28)) goto LAB_00120530;
          uVar24 = -sVar8 & (sVar8 + uVar23) - 1;
          EVar5 = VirtMem::alloc(&local_78.rx,uVar24,kMMapLargePages|kAccessRWX);
          if (EVar5 != 0) goto LAB_00120530;
          uVar13 = uVar13 | 8;
        }
        local_78.rw = local_78.rx;
        uVar23 = uVar24;
      }
      else {
        EVar5 = VirtMem::allocDualMapping(&local_78,uVar23,kAccessRWX);
        if (EVar5 != 0) goto LAB_00120867;
        uVar13 = uVar13 | 0x10;
      }
      uVar12 = (pJVar1->granularity + uVar23) - 1 >> (pJVar1->granularityLog2 & 0x3f);
      uVar21 = (uint32_t)uVar12;
      uVar27 = uVar21 + 0x3f >> 6;
      block = (JitAllocatorBlock *)malloc((ulong)(uVar27 << 4) + 0x68);
      p = local_78.rw;
      JVar3 = (impl->super_Impl).options;
      uVar24 = (ulong)JVar3;
      if (block != (JitAllocatorBlock *)0x0) {
        if ((JVar3 & kFillUnusedMemory) != kNone) {
          VirtMem::protectJitMemory(kReadWrite);
          JitAllocatorImpl_fillPattern(local_78.rw,(impl->super_Impl).fillPattern,uVar23);
          VirtMem::protectJitMemory(kReadExecute);
          VirtMem::flushInstructionCache(p,uVar23);
        }
        *(undefined8 *)&block->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
        *(undefined8 *)&block->field_0x18 = 0;
        *(undefined8 *)block = 0;
        *(undefined8 *)&block->field_0x8 = 0;
        block->_pool = pJVar1;
        (block->_mapping).rx = local_78.rx;
        (block->_mapping).rw = local_78.rw;
        block->_blockSize = uVar23;
        block->_flags = uVar13;
        block->_areaSize = uVar21;
        block->_areaUsed = 0;
        block->_largestUnusedArea = 0;
        block->_searchStart = 0;
        block->_searchEnd = 0;
        block->_usedBitVector = (BitWord *)(block + 1);
        block->_stopBitVector =
             (BitWord *)
             (&block[1].super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + (ulong)uVar27 * 8);
        uVar23 = (ulong)((uint)((uVar12 & 0xffffffff) + 0x3f >> 3) & 0xfffffff8);
        memset(block + 1,0,uVar23);
        memset(&block[1].super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + (ulong)uVar27 * 8,0
               ,uVar23);
        puVar22 = block->_usedBitVector;
        if ((uVar13 & 1) == 0) {
          *puVar22 = *puVar22 & 0xfffffffffffffffe;
          *block->_stopBitVector = *block->_stopBitVector & 0xfffffffffffffffe;
        }
        else {
          *puVar22 = *puVar22 | 1;
          *block->_stopBitVector = *block->_stopBitVector | 1;
        }
        uVar13 = block->_flags & 1;
        uVar14 = (ulong)uVar13;
        block->_areaUsed = uVar13;
        block->_largestUnusedArea = block->_areaSize - uVar13;
        block->_searchStart = uVar13;
        block->_searchEnd = block->_areaSize;
        block->_flags = block->_flags & 0xfffffff9 | 2;
        JitAllocatorImpl_insertBlock(impl,block);
        uVar13 = (uint)local_48;
        uVar27 = block->_searchStart + uVar13;
        uVar11 = (ulong)uVar27;
        block->_searchStart = uVar27;
        block->_largestUnusedArea = block->_largestUnusedArea - uVar13;
        pBVar20 = block->_usedBitVector;
        uVar12 = local_48 & 0xffffffff;
LAB_001206de:
        impl->allocationCount = impl->allocationCount + 1;
        uVar27 = (uint)uVar14;
        uVar21 = uVar27 + uVar13;
        if (uVar13 != 0) {
          uVar23 = uVar14 >> 6 & 0x3ffffff;
          uVar24 = 0x40 - (ulong)(uVar27 & 0x3f);
          if (uVar12 <= uVar24) {
            uVar24 = uVar12;
          }
          puVar22 = pBVar20 + uVar23;
          puVar17 = puVar22 + 1;
          *puVar22 = *puVar22 |
                     (0xffffffffffffffffU >> (-(char)uVar24 & 0x3fU)) << (sbyte)(uVar27 & 0x3f);
          uVar16 = uVar12 - uVar24;
          if (0x3f < uVar16) {
            uVar16 = (uVar12 - uVar24) - 0x40;
            uVar24 = uVar16 >> 6;
            local_58 = pBVar20;
            local_50 = uVar11;
            memset(puVar17,0xff,uVar24 * 8 + 8);
            uVar13 = (uint)local_48;
            uVar16 = (ulong)((uint)uVar16 & 0x3f);
            puVar17 = local_58 + uVar23 + uVar24 + 2;
            uVar11 = local_50;
          }
          if (uVar16 != 0) {
            *puVar17 = *puVar17 | 0xffffffffffffffffU >> (-(char)uVar16 & 0x3fU);
          }
        }
        block->_stopBitVector[uVar21 - 1 >> 6] =
             block->_stopBitVector[uVar21 - 1 >> 6] | 1L << ((byte)(uVar21 - 1) & 0x3f);
        uVar6 = block->_flags;
        plVar2 = (long *)((long)block->_pool->totalAreaUsed + (ulong)(uVar6 & 8));
        *plVar2 = *plVar2 + uVar12;
        uVar9 = block->_areaUsed + uVar13;
        block->_areaUsed = uVar9;
        if (block->_areaSize == uVar9) {
          block->_searchStart = uVar9;
          block->_searchEnd = 0;
          block->_largestUnusedArea = 0;
          uVar6 = uVar6 & 0xfffffff9;
        }
        else {
          if ((uint)uVar11 == uVar27) {
            block->_searchStart = uVar21;
          }
          if (block->_searchEnd == uVar21) {
            block->_searchEnd = uVar27;
          }
          uVar6 = uVar6 & 0xfffffff9 | 4;
        }
        block->_flags = uVar6;
        uVar24 = (ulong)pJVar1->granularity * (uVar14 & 0xffffffff);
        uVar12 = block->_blockSize - local_60;
        if (uVar24 < uVar12 || uVar24 - uVar12 == 0) {
          local_38->_rx = (void *)((long)(block->_mapping).rx + uVar24);
          local_38->_rw = (void *)(uVar24 + (long)(block->_mapping).rw);
          local_38->_size = local_60;
          local_38->_block = block;
          EVar5 = 0;
          goto LAB_00120867;
        }
        alloc();
        uVar24 = extraout_RAX;
      }
      if ((uVar24 & 1) == 0) {
        VirtMem::release(local_78.rx,uVar23);
      }
      else {
        VirtMem::releaseDualMapping(&local_78,uVar23);
      }
    }
  }
  else if (uVar12 != 0) goto LAB_001204b6;
  EVar5 = 1;
LAB_00120867:
  pthread_mutex_unlock((pthread_mutex_t *)&impl->lock);
  return EVar5;
code_r0x0012039b:
  uVar18 = uVar25;
  if (uVar16 <= uVar25) goto code_r0x001203a7;
  goto LAB_00120377;
code_r0x001203a7:
  uVar25 = 0;
LAB_001203ee:
  uVar26 = uVar23 - uVar14;
  if (uVar26 < uVar12) {
    if (uVar14 < uVar19) {
      uVar19 = uVar14;
    }
    if (uVar7 <= uVar26) {
      uVar7 = uVar26;
    }
    goto LAB_0012030b;
  }
  if ((int)uVar14 != -1) {
    if ((uVar27 & 2) != 0) {
      pJVar1->emptyBlockCount = pJVar1->emptyBlockCount + 0xff;
      block->_flags = uVar27 & 0xfffffffd;
    }
    goto LAB_001206de;
  }
LAB_00120415:
  if (uVar19 != 0xffffffffffffffff) {
    block->_searchStart = (uint32_t)uVar19;
    block->_searchEnd = (uint32_t)uVar23;
    block->_largestUnusedArea = (uint32_t)uVar7;
    block->_flags = uVar27 & 0xfffffffb;
  }
LAB_00120437:
  block = pJVar15;
  if (pJVar15 == pJVar4) goto LAB_00120440;
  goto LAB_0012026f;
}

Assistant:

Error JitAllocator::alloc(Span& out, size_t size) noexcept {
  out = Span{};

  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  constexpr uint32_t kNoIndex = std::numeric_limits<uint32_t>::max();

  // Align to the minimum granularity by default.
  size = Support::alignUp<size_t>(size, impl->granularity);
  if (ASMJIT_UNLIKELY(size == 0))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(size > std::numeric_limits<uint32_t>::max() / 2))
    return DebugUtils::errored(kErrorTooLarge);

  LockGuard guard(impl->lock);
  JitAllocatorPool* pool = &impl->pools[JitAllocatorImpl_sizeToPoolId(impl, size)];

  uint32_t areaIndex = kNoIndex;
  uint32_t areaSize = uint32_t(pool->areaSizeFromByteSize(size));

  // Try to find the requested memory area in existing blocks.
  JitAllocatorBlock* block = pool->blocks.first();
  if (block) {
    JitAllocatorBlock* initial = block;
    do {
      JitAllocatorBlock* next = block->hasNext() ? block->next() : pool->blocks.first();
      if (block->areaAvailable() >= areaSize) {
        if (block->isDirty() || block->largestUnusedArea() >= areaSize) {
          BitVectorRangeIterator<Support::BitWord, 0> it(block->_usedBitVector, pool->bitWordCountFromAreaSize(block->areaSize()), block->_searchStart, block->_searchEnd);

          size_t rangeStart = 0;
          size_t rangeEnd = block->areaSize();

          size_t searchStart = SIZE_MAX;
          size_t largestArea = 0;

          while (it.nextRange(&rangeStart, &rangeEnd, areaSize)) {
            size_t rangeSize = rangeEnd - rangeStart;
            if (rangeSize >= areaSize) {
              areaIndex = uint32_t(rangeStart);
              break;
            }

            searchStart = Support::min(searchStart, rangeStart);
            largestArea = Support::max(largestArea, rangeSize);
          }

          if (areaIndex != kNoIndex)
            break;

          if (searchStart != SIZE_MAX) {
            // Because we have iterated over the entire block, we can now mark the
            // largest unused area that can be used to cache the next traversal.
            size_t searchEnd = rangeEnd;

            block->_searchStart = uint32_t(searchStart);
            block->_searchEnd = uint32_t(searchEnd);
            block->_largestUnusedArea = uint32_t(largestArea);
            block->clearFlags(JitAllocatorBlock::kFlagDirty);
          }
        }
      }

      block = next;
    } while (block != initial);
  }

  // Allocate a new block if there is no region of a required size.
  if (areaIndex == kNoIndex) {
    size_t blockSize = JitAllocatorImpl_calculateIdealBlockSize(impl, pool, size);
    if (ASMJIT_UNLIKELY(!blockSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    ASMJIT_PROPAGATE(JitAllocatorImpl_newBlock(impl, &block, pool, blockSize));
    areaIndex = block->initialAreaStart();

    JitAllocatorImpl_insertBlock(impl, block);
    block->_searchStart += areaSize;
    block->_largestUnusedArea -= areaSize;
  }
  else if (block->hasFlag(JitAllocatorBlock::kFlagEmpty)) {
    pool->emptyBlockCount--;
    block->clearFlags(JitAllocatorBlock::kFlagEmpty);
  }

  // Update statistics.
  impl->allocationCount++;
  block->markAllocatedArea(areaIndex, areaIndex + areaSize);

  // Return a span referencing the allocated memory.
  size_t offset = pool->byteSizeFromAreaSize(areaIndex);
  ASMJIT_ASSERT(offset <= block->blockSize() - size);

  out._rx = block->rxPtr() + offset;
  out._rw = block->rwPtr() + offset;
  out._size = size;
  out._block = static_cast<void*>(block);

  return kErrorOk;
}